

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DArrayView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  int y;
  ulong uVar7;
  deInt32 srcSize;
  int x;
  int x_00;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar10 [16];
  float fVar12;
  undefined4 uVar19;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined8 uVar20;
  undefined1 auVar18 [16];
  Vector<float,_4> VVar21;
  Texture1DArrayView TVar22;
  Vec3 triT [2];
  Texture1DArrayView src_1;
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  float local_e8 [6];
  Sampler *local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  IVec2 local_b0;
  undefined1 local_a8 [16];
  Vec3 local_98;
  undefined1 local_8c [20];
  ulong local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  pointer local_58;
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  fVar8 = *texCoord;
  fVar9 = texCoord[1];
  fVar1 = texCoord[2];
  fVar12 = texCoord[4];
  fVar2 = texCoord[6];
  fVar3 = texCoord[3];
  fVar4 = texCoord[5];
  fVar5 = texCoord[7];
  local_68 = ZEXT416(0);
  local_58 = (pointer)0x0;
  local_d0 = &params->sampler;
  TVar22 = tcu::getEffectiveTextureView
                     (src,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)local_68,local_d0);
  local_a8._8_8_ = TVar22.m_levels;
  local_a8._0_4_ = TVar22.m_numLevels;
  local_78 = 0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_78 = (ulong)(uint)(params->super_RenderParams).bias;
  }
  uStack_70 = 0;
  local_b0.m_data[0] = dst->m_width;
  local_b0.m_data[1] = dst->m_height;
  srcSize = 0;
  if (0 < (int)local_a8._0_4_) {
    srcSize = (((ConstPixelBufferAccess *)local_a8._8_8_)->m_size).m_data[0];
  }
  local_e8[0] = fVar9;
  local_e8[1] = fVar3;
  local_e8[2] = fVar4;
  local_e8[3] = fVar5;
  local_e8[4] = fVar4;
  local_e8[5] = fVar3;
  local_98.m_data[0] = fVar8;
  local_98.m_data[1] = fVar1;
  local_98.m_data[2] = fVar12;
  local_8c._0_4_ = fVar2;
  local_8c._4_4_ = fVar12;
  local_8c._8_4_ = fVar1;
  fVar8 = computeNonProjectedTriLod(params->lodMode,&local_b0,srcSize,&local_98);
  fVar9 = computeNonProjectedTriLod(params->lodMode,&local_b0,srcSize,(Vec3 *)local_8c);
  uVar19 = (undefined4)(local_78 >> 0x20);
  auVar17._8_4_ = uVar19;
  auVar17._0_8_ = local_78;
  auVar17._12_4_ = uVar19;
  auVar18._0_4_ = (float)local_78;
  auVar18._8_8_ = auVar17._8_8_;
  auVar18._4_4_ = auVar18._0_4_;
  local_b8 = CONCAT44(fVar9 + auVar18._0_4_,fVar8 + auVar18._0_4_);
  y = 0;
  uVar19 = extraout_XMM0_Db;
  do {
    if (dst->m_height <= y) {
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base((_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     *)local_68);
      return;
    }
    uVar11 = uVar19;
    for (x_00 = 0; x_00 < dst->m_width; x_00 = x_00 + 1) {
      auVar13._4_12_ = auVar18._4_12_;
      auVar13._0_4_ = (float)x_00 + 0.5;
      auVar15._12_4_ = auVar18._12_4_;
      auVar15._0_8_ = auVar13._0_8_;
      auVar15._8_4_ = auVar18._4_4_;
      auVar14._8_8_ = auVar15._8_8_;
      auVar14._4_4_ = (float)y + 0.5;
      auVar14._0_4_ = auVar13._0_4_;
      auVar16._0_12_ = auVar14._0_12_;
      auVar16._12_4_ = uVar19;
      auVar10._0_4_ = (float)dst->m_width;
      auVar10._4_4_ = (float)dst->m_height;
      auVar10._8_8_ = 0;
      auVar17 = divps(auVar16,auVar10);
      fVar8 = auVar17._4_4_;
      bVar6 = 1.0 <= auVar17._0_4_ + fVar8;
      if (bVar6) {
        auVar17 = ZEXT416((uint)(1.0 - auVar17._0_4_));
        if (!bVar6) goto LAB_008b11fb;
LAB_008b11e4:
        fVar9 = auVar17._0_4_;
        fVar8 = 1.0 - fVar8;
      }
      else {
        if (bVar6) goto LAB_008b11e4;
LAB_008b11fb:
        fVar9 = auVar17._0_4_;
      }
      uVar7 = (ulong)bVar6;
      fVar1 = (&local_98)[uVar7].m_data[0];
      fVar12 = ((&local_98)[uVar7].m_data[1] - fVar1) * fVar8 +
               (*(float *)(local_8c + uVar7 * 0xc + -4) - fVar1) * fVar9 + fVar1;
      uVar20 = 0;
      fVar1 = local_e8[uVar7 * 3];
      fVar9 = (local_e8[uVar7 * 3 + 1] - fVar1) * fVar8 +
              (local_e8[uVar7 * 3 + 2] - fVar1) * fVar9 + fVar1;
      fVar8 = *(float *)((long)&local_b8 + uVar7 * 4);
      if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
        local_c8._0_4_ =
             tcu::Texture1DArrayView::sampleCompare
                       ((Texture1DArrayView *)local_a8,local_d0,(params->super_RenderParams).ref,
                        fVar12,fVar9,fVar8);
        local_c8._4_8_ = 0;
        local_c8._12_4_ = 1.0;
      }
      else {
        uVar20 = 0;
        tcu::Texture1DArrayView::sample
                  ((Texture1DArrayView *)local_c8,(Sampler *)local_a8,fVar12,fVar9,fVar8);
      }
      tcu::operator*(local_50,(Vector<float,_4> *)local_c8,&(params->super_RenderParams).colorScale)
      ;
      VVar21 = tcu::operator+(local_40,(Vector<float,_4> *)local_50,
                              &(params->super_RenderParams).colorBias);
      auVar18._0_8_ = VVar21.m_data._8_8_;
      auVar18._8_8_ = uVar20;
      tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_40,x_00,y);
      uVar11 = extraout_XMM0_Db_00;
    }
    y = y + 1;
    uVar19 = uVar11;
  } while( true );
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2014-06-09 mika] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, params);
}